

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::setData
          (GLAttributeBuffer *this,vector<float,_std::allocator<float>_> *data)

{
  pointer pfVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  checkType(this,Float);
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((this->super_AttributeBuffer).setFlag == false) {
    uVar4 = (this->super_AttributeBuffer).bufferSize;
    uVar3 = (long)pfVar2 - (long)pfVar1 >> 2;
  }
  else {
    uVar4 = (this->super_AttributeBuffer).bufferSize;
    uVar3 = (long)pfVar2 - (long)pfVar1 >> 2;
    if (uVar3 <= uVar4) goto LAB_00292646;
  }
  (this->super_AttributeBuffer).setFlag = true;
  uVar5 = uVar4 * 2;
  if (uVar4 * 2 < uVar3) {
    uVar5 = uVar3;
  }
  (this->super_AttributeBuffer).bufferSize = uVar5;
LAB_00292646:
  (this->super_AttributeBuffer).dataSize = uVar3;
  return;
}

Assistant:

void GLAttributeBuffer::setData(const std::vector<float>& data) {
  checkType(RenderDataType::Float);
  setData_helper(data);
}